

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

bool __thiscall Spi::sync_mpsse(Spi *this)

{
  int iVar1;
  long lVar2;
  DWORD dwNumBytesRead;
  DWORD dwNumBytesToRead;
  BYTE byInputBuffer [8];
  DWORD dwNumBytesSent;
  BYTE byOutputBuffer [8];
  
  dwNumBytesToRead = 0;
  byOutputBuffer[0] = 0xaa;
  FT_Write(this->ftHandle,byOutputBuffer,1);
  do {
    iVar1 = FT_GetQueueStatus(this->ftHandle,&dwNumBytesToRead);
  } while (iVar1 == 0 && dwNumBytesToRead == 0);
  FT_Read(this->ftHandle,byInputBuffer);
  for (lVar2 = 0;
      (lVar2 != 0xffffffff && ((byInputBuffer[lVar2] != 0xfa || (byInputBuffer[lVar2 + 1] != 0xaa)))
      ); lVar2 = lVar2 + 1) {
  }
  return lVar2 != 0xffffffff;
}

Assistant:

bool Spi::sync_mpsse() {
	BYTE byOutputBuffer[8]; // Buffer to hold MPSSE commands and data to be sent to the FT2232H
	BYTE byInputBuffer[8]; // Buffer to hold data read from the FT2232H
	DWORD dwCount = 0; // General loop index
	DWORD dwNumBytesToSend = 0; // Index to the output buffer
	DWORD dwNumBytesSent = 0; // Count of actual bytes sent - used with FT_Write
	DWORD dwNumBytesToRead = 0; // Number of bytes available to read in the driver's input buffer
	DWORD dwNumBytesRead = 0; // Count of actual bytes read - used with FT_Read
	FT_STATUS ftStatus;

	byOutputBuffer[dwNumBytesToSend++] = 0xAA;	//'\xAA';
	//Add bogus command ‘xAA’ to the queue
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the BAD commands
	dwNumBytesToSend = 0; // Reset output buffer pointer
	do {
		ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
		// Get the number of bytes in the device input buffer
	} while ((dwNumBytesToRead == 0) && (ftStatus == FT_OK));
	if (dwNumBytesRead > 8) {
		cerr << "Input buffer too small in sync_mpsse()!" << endl;
		return false;
	}
	//or Timeout
	bool bCommandEchod = false;
	ftStatus = FT_Read(ftHandle, &byInputBuffer, dwNumBytesToRead,
			&dwNumBytesRead);
	//Read out the data from input buffer
	for (dwCount = 0; dwCount < dwNumBytesRead - 1; dwCount++)
	//Check if Bad command and echo command received
			{
		if ((byInputBuffer[dwCount] == 0xFA)
				&& (byInputBuffer[dwCount + 1] == 0xAA)) {
			bCommandEchod = true;
			break;
		}
	}

	return bCommandEchod;
}